

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

Block * __thiscall
soul::PoolAllocator::
allocate<soul::AST::Block,soul::AST::Context,soul::pool_ptr<soul::AST::Function>&>
          (PoolAllocator *this,Context *args,pool_ptr<soul::AST::Function> *args_1)

{
  PoolItem *pPVar1;
  pool_ptr<soul::AST::Function> local_28;
  
  pPVar1 = allocateSpaceForObject(this,0x50);
  local_28 = (pool_ptr<soul::AST::Function>)args_1->object;
  AST::Block::Block((Block *)&pPVar1->item,args,&local_28);
  pPVar1->destructor =
       allocate<soul::AST::Block,_soul::AST::Context,_soul::pool_ptr<soul::AST::Function>_&>::
       anon_class_1_0_00000001::__invoke;
  return (Block *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }